

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

uint __thiscall
AtomicTransactionalIncrement<unsigned_int>::Increment
          (AtomicTransactionalIncrement<unsigned_int> *this,AtomicT *atomic)

{
  uint uVar1;
  AtomicT *pAVar2;
  AtomicT *atomic_local;
  AtomicTransactionalIncrement<unsigned_int> *this_local;
  
  this->m_Atomic = atomic;
  pAVar2 = this->m_Atomic;
  LOCK();
  uVar1 = (pAVar2->super___atomic_base<unsigned_int>)._M_i;
  (pAVar2->super___atomic_base<unsigned_int>)._M_i =
       (pAVar2->super___atomic_base<unsigned_int>)._M_i + 1;
  UNLOCK();
  return uVar1;
}

Assistant:

T Increment(AtomicT* atomic)
    {
        m_Atomic = atomic;
        return m_Atomic->fetch_add(1);
    }